

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O1

void visit_keyword_expr(gvisitor_t *self,gnode_keyword_expr_t *node)

{
  gtoken_t gVar1;
  long *plVar2;
  ircode_t *code;
  uint32_t uVar3;
  char *format;
  
  plVar2 = *(long **)(*(long *)((long)self->data + 0x10) + -8 + *self->data * 8);
  if ((plVar2 == (long *)0x0) || ((gravity_class_t *)*plVar2 != gravity_class_function)) {
    format = "Invalid code context.";
  }
  else {
    code = (ircode_t *)plVar2[0x14];
    gVar1 = (node->base).token.type;
    if ((int)gVar1 < 0x27) {
      if (gVar1 == TOK_KEY_SUPER) {
        ircode_register_push(code,0);
        return;
      }
      if (gVar1 == TOK_KEY_TRUE) {
        if (node == (gnode_keyword_expr_t *)0x0) {
          uVar3 = 0;
        }
        else {
          uVar3 = (node->base).token.lineno;
        }
        ircode_add_constant(code,0x1005,uVar3);
        return;
      }
      if (gVar1 == TOK_KEY_FALSE) {
        if (node == (gnode_keyword_expr_t *)0x0) {
          uVar3 = 0;
        }
        else {
          uVar3 = (node->base).token.lineno;
        }
        ircode_add_constant(code,0x1006,uVar3);
        return;
      }
    }
    else {
      switch(gVar1) {
      case TOK_KEY_NULL:
        if (node == (gnode_keyword_expr_t *)0x0) {
          uVar3 = 0;
        }
        else {
          uVar3 = (node->base).token.lineno;
        }
        ircode_add_constant(code,0x1002,uVar3);
        return;
      case TOK_KEY_UNDEFINED:
        if (node == (gnode_keyword_expr_t *)0x0) {
          uVar3 = 0;
        }
        else {
          uVar3 = (node->base).token.lineno;
        }
        ircode_add_constant(code,0x1003,uVar3);
        return;
      case TOK_KEY_CURRFUNC:
        if (node == (gnode_keyword_expr_t *)0x0) {
          uVar3 = 0;
        }
        else {
          uVar3 = (node->base).token.lineno;
        }
        ircode_add_constant(code,0x1007,uVar3);
        return;
      case TOK_KEY_CURRARGS:
        *(undefined1 *)((long)plVar2 + 0xb4) = 1;
        if (node == (gnode_keyword_expr_t *)0x0) {
          uVar3 = 0;
        }
        else {
          uVar3 = (node->base).token.lineno;
        }
        ircode_add_constant(code,0x1004,uVar3);
        return;
      }
    }
    format = "Invalid keyword expression.";
  }
  report_error(self,&node->base,format);
  return;
}

Assistant:

static void visit_keyword_expr (gvisitor_t *self, gnode_keyword_expr_t *node) {
    DEBUG_CODEGEN("visit_keyword_expr %s", token_name(node->base.token.type));
    DECLARE_CODE();

    CODEGEN_COUNT_REGISTERS(n1);

    gtoken_t type = NODE_TOKEN_TYPE(node);
    switch (type) {
        case TOK_KEY_CURRFUNC:
			ircode_add_constant(code, CPOOL_VALUE_FUNC, LINE_NUMBER(node));
            break;

        case TOK_KEY_NULL:
			ircode_add_constant(code, CPOOL_VALUE_NULL, LINE_NUMBER(node));
            break;

        case TOK_KEY_SUPER:
            ircode_register_push(code, 0);
            break;

        case TOK_KEY_CURRARGS:
            // compiler can know in advance if arguments special array is used
            context_function->useargs = true;
			ircode_add_constant(code, CPOOL_VALUE_ARGUMENTS, LINE_NUMBER(node));
            break;

        case TOK_KEY_UNDEFINED:
			ircode_add_constant(code, CPOOL_VALUE_UNDEFINED, LINE_NUMBER(node));
            break;

        case TOK_KEY_TRUE:
			ircode_add_constant(code, CPOOL_VALUE_TRUE, LINE_NUMBER(node));
            break;

        case TOK_KEY_FALSE:
			ircode_add_constant(code, CPOOL_VALUE_FALSE, LINE_NUMBER(node));
            break;

        default:
            report_error(self, (gnode_t *)node, "Invalid keyword expression.");
            break;
    }

    CODEGEN_COUNT_REGISTERS(n2);
    CODEGEN_ASSERT_REGISTERS(n1, n2, 1);
}